

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  ARKodeSplittingStepMem pAVar1;
  int iVar2;
  N_Vector p_Var3;
  long lVar4;
  ARKodeSplittingStepMem step_mem;
  
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar2 = splittingStep_AccessStepMem(ark_mem,"splittingStep_FullRHS",&step_mem);
  pAVar1 = step_mem;
  if (iVar2 == 0) {
    for (lVar4 = 0; lVar4 < pAVar1->partitions; lVar4 = lVar4 + 1) {
      p_Var3 = f;
      if (lVar4 != 0) {
        p_Var3 = ark_mem->tempv1;
      }
      iVar2 = SUNStepper_FullRhs(t,pAVar1->steppers[lVar4],y,p_Var3,2);
      if (iVar2 != 0) {
        arkProcessError(ark_mem,-8,0xc4,"splittingStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                        ,t);
        return -8;
      }
      if (lVar4 != 0) {
        N_VLinearSum(0x3ff0000000000000,0,f,ark_mem->tempv1,f);
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int splittingStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y,
                                 N_Vector f, SUNDIALS_MAYBE_UNUSED int mode)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  for (int i = 0; i < step_mem->partitions; i++)
  {
    SUNErrCode err = SUNStepper_FullRhs(step_mem->steppers[i], t, y,
                                        i == 0 ? f : ark_mem->tempv1,
                                        SUN_FULLRHS_OTHER);
    if (err != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }
    if (i > 0) { N_VLinearSum(ONE, f, ONE, ark_mem->tempv1, f); }
  }

  return ARK_SUCCESS;
}